

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deAppendList.hpp
# Opt level: O0

void __thiscall
de::AppendList<vk::AllocationCallbackRecord>::~AppendList
          (AppendList<vk::AllocationCallbackRecord> *this)

{
  Block *pBVar1;
  Block *pBVar2;
  Block *delBlock;
  Block *curBlock;
  size_t elementNdx;
  AppendList<vk::AllocationCallbackRecord> *this_local;
  
  curBlock = (Block *)0x0;
  pBVar1 = this->m_first;
  while (delBlock = pBVar1, delBlock != (Block *)0x0) {
    pBVar1 = delBlock->next;
    for (; pBVar2 = (Block *)min<unsigned_long>(this->m_numElements,
                                                (delBlock->blockNdx + 1) * this->m_blockSize),
        curBlock < pBVar2; curBlock = (Block *)((long)&curBlock->blockNdx + 1)) {
    }
    if (delBlock != (Block *)0x0) {
      Block::~Block(delBlock);
      operator_delete(delBlock,0x18);
    }
  }
  return;
}

Assistant:

AppendList<ElementType>::~AppendList (void)
{
	size_t	elementNdx	= 0;
	Block*	curBlock	= m_first;

	while (curBlock)
	{
		Block* const	delBlock	= curBlock;

		curBlock = delBlock->next;

		// Call destructor for allocated elements
		for (; elementNdx < min(m_numElements, (delBlock->blockNdx+1)*m_blockSize); ++elementNdx)
			delBlock->elements[elementNdx%m_blockSize].~ElementType();

		delete delBlock;
	}

	DE_ASSERT(elementNdx == m_numElements);
}